

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float32_eq_riscv64(float32 a,float32 b,float_status *status)

{
  float32 a_00;
  float32 a_01;
  int iVar1;
  uint32_t uVar2;
  bool local_29;
  uint32_t bv;
  uint32_t av;
  float_status *status_local;
  float32 b_local;
  float32 a_local;
  
  a_00 = float32_squash_input_denormal_riscv64(a,status);
  a_01 = float32_squash_input_denormal_riscv64(b,status);
  iVar1 = extractFloat32Exp(a_00);
  if (((iVar1 == 0xff) && (uVar2 = extractFloat32Frac(a_00), uVar2 != 0)) ||
     ((iVar1 = extractFloat32Exp(a_01), iVar1 == 0xff &&
      (uVar2 = extractFloat32Frac(a_01), uVar2 != 0)))) {
    float_raise_riscv64('\x01',status);
    b_local = 0;
  }
  else {
    local_29 = a_00 == a_01 || ((a_00 | a_01) & 0x7fffffff) == 0;
    b_local = (float32)local_29;
  }
  return b_local;
}

Assistant:

int float32_eq(float32 a, float32 b, float_status *status)
{
    uint32_t av, bv;
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    av = float32_val(a);
    bv = float32_val(b);
    return ( av == bv ) || ( (uint32_t) ( ( av | bv )<<1 ) == 0 );
}